

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_identifier(string *str)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  string *in_RDI;
  int i;
  int local_14;
  
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    bVar1 = str_utils::is_alpha(*pcVar4);
    if (bVar1) {
      local_14 = 1;
      while( true ) {
        iVar2 = std::__cxx11::string::size();
        if (iVar2 <= local_14) {
          bVar1 = is_reserved_word(in_RDI);
          return (bool)((bVar1 ^ 0xffU) & 1);
        }
        std::__cxx11::string::operator[]((ulong)in_RDI);
        bVar1 = str_utils::is_alphanumeric('\0');
        if ((!bVar1) &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar4 != '_'))
        break;
        local_14 = local_14 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool Grammar::is_identifier(const std::string& str) {
    if (str.size() == 0 || !str_utils::is_alpha(str[0]))
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_alphanumeric(str[i]) && str[i] != '_')
            return false;
    return !is_reserved_word(str);
}